

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestConflictingSymbolNames_Data1::Clear(TestConflictingSymbolNames_Data1 *this)

{
  uint32_t cached_has_bits;
  TestConflictingSymbolNames_Data1 *this_local;
  
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.data_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestConflictingSymbolNames_Data1::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestConflictingSymbolNames.Data1)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.data_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}